

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O1

void BrotliCreateZopfliBackwardReferences
               (MemoryManager *m,size_t num_bytes,size_t position,uint8_t *ringbuffer,
               size_t ringbuffer_mask,BrotliEncoderParams *params,HasherHandle hasher,
               int *dist_cache,size_t *last_insert_len,Command_conflict *commands,
               size_t *num_commands,size_t *num_literals)

{
  int iVar1;
  ZopfliNode *nodes;
  anon_union_4_3_cc401a1e_for_u *paVar2;
  size_t sVar3;
  long lVar4;
  size_t max_backward_limit;
  
  iVar1 = params->lgwin;
  lVar4 = num_bytes + 1;
  if (lVar4 == 0) {
    nodes = (ZopfliNode *)0x0;
  }
  else {
    nodes = (ZopfliNode *)BrotliAllocate(m,lVar4 * 0x10);
    paVar2 = &nodes->u;
    do {
      ((ZopfliNode *)(paVar2 + -3))->length = 1;
      ((ZopfliNode *)(paVar2 + -3))->distance = 0;
      *(undefined8 *)(paVar2 + -1) = 0x7effc99e00000000;
      paVar2 = paVar2 + 4;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  max_backward_limit = (1L << ((byte)iVar1 & 0x3f)) - 0x10;
  sVar3 = BrotliZopfliComputeShortestPath
                    (m,num_bytes,position,ringbuffer,ringbuffer_mask,params,max_backward_limit,
                     dist_cache,hasher,nodes);
  *num_commands = *num_commands + sVar3;
  BrotliZopfliCreateCommands
            (num_bytes,position,max_backward_limit,nodes,dist_cache,last_insert_len,params,commands,
             num_literals);
  BrotliFree(m,nodes);
  return;
}

Assistant:

void BrotliCreateZopfliBackwardReferences(MemoryManager* m,
    size_t num_bytes, size_t position, const uint8_t* ringbuffer,
    size_t ringbuffer_mask, const BrotliEncoderParams* params,
    HasherHandle hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  ZopfliNode* nodes;
  nodes = BROTLI_ALLOC(m, ZopfliNode, num_bytes + 1);
  if (BROTLI_IS_OOM(m)) return;
  BrotliInitZopfliNodes(nodes, num_bytes + 1);
  *num_commands += BrotliZopfliComputeShortestPath(m,
      num_bytes, position, ringbuffer, ringbuffer_mask,
      params, max_backward_limit, dist_cache, hasher, nodes);
  if (BROTLI_IS_OOM(m)) return;
  BrotliZopfliCreateCommands(num_bytes, position, max_backward_limit, nodes,
      dist_cache, last_insert_len, params, commands, num_literals);
  BROTLI_FREE(m, nodes);
}